

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode.h
# Opt level: O2

string * __thiscall sfc::mode_abi_cxx11_(string *__return_storage_ptr__,sfc *this,Mode mode)

{
  char *__s;
  allocator<char> local_9;
  
  switch((int)this) {
  case 1:
    __s = "snes";
    break;
  case 2:
    __s = "snes_mode7";
    break;
  case 3:
    __s = "gb";
    break;
  case 4:
    __s = "gbc";
    break;
  case 5:
    __s = "gba";
    break;
  case 6:
    __s = "gba_affine";
    break;
  case 7:
    __s = "md";
    break;
  case 8:
    __s = "pce";
    break;
  case 9:
    __s = "pce_sprite";
    break;
  case 10:
    __s = "ws";
    break;
  case 0xb:
    __s = "wsc";
    break;
  case 0xc:
    __s = "wsc_packed";
    break;
  case 0xd:
    __s = "ngp";
    break;
  case 0xe:
    __s = "ngpc";
    break;
  case 0xf:
    __s = "sms";
    break;
  case 0x10:
    __s = "gg";
    break;
  default:
    __s = "none";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

inline std::string mode(Mode mode) {
  switch (mode) {
  case Mode::snes:
    return std::string("snes");
  case Mode::snes_mode7:
    return std::string("snes_mode7");
  case Mode::gb:
    return std::string("gb");
  case Mode::gbc:
    return std::string("gbc");
  case Mode::gba:
    return std::string("gba");
  case Mode::gba_affine:
    return std::string("gba_affine");
  case Mode::md:
    return std::string("md");
  case Mode::pce:
    return std::string("pce");
  case Mode::pce_sprite:
    return std::string("pce_sprite");
  case Mode::ws:
    return std::string("ws");
  case Mode::wsc:
    return std::string("wsc");
  case Mode::wsc_packed:
    return std::string("wsc_packed");
  case Mode::ngp:
    return std::string("ngp");
  case Mode::ngpc:
    return std::string("ngpc");
  case Mode::sms:
    return std::string("sms");
  case Mode::gg:
    return std::string("gg");
  default:
    return std::string("none");
  }
}